

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<Tint>::vec(vec<Tint> *this,uint _sz,Tint *pad)

{
  undefined4 *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  uint i;
  void *local_30;
  uint local_1c;
  
  *in_RDI = in_ESI;
  in_RDI[1] = *in_RDI;
  if (*in_RDI == 0) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = malloc((ulong)in_RDI[1] << 2);
  }
  *(void **)(in_RDI + 2) = local_30;
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 2) + (ulong)local_1c * 4) = *in_RDX;
  }
  return;
}

Assistant:

vec(unsigned int _sz, const T& pad) : sz(_sz), cap(sz) {
		data = sz != 0 ? (T*)malloc(cap * sizeof(T)) : nullptr;
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(pad);
		}
	}